

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> * __thiscall
kj::_::ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>::operator=
          (ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *this,
          ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *param_1)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  NullableValue<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>::operator=
            (&(this->value).ptr,&(param_1->value).ptr);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;